

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O2

int gzflush(gzFile file,int flush)

{
  int iVar1;
  
  if (file == (gzFile)0x0) {
    return -2;
  }
  if (file[1].have != 0x79b1) {
    return -2;
  }
  if (4 < (uint)flush) {
    return -2;
  }
  if (*(int *)((long)&file[4].next + 4) != 0) {
    return -2;
  }
  if (*(int *)&file[4].next != 0) {
    *(undefined4 *)&file[4].next = 0;
    iVar1 = gz_zero((gz_statep)file,*(off64_t *)(file + 4));
    if (iVar1 == -1) goto LAB_001081ef;
  }
  gz_comp((gz_statep)file,flush);
LAB_001081ef:
  return *(int *)((long)&file[4].next + 4);
}

Assistant:

int ZEXPORT gzflush(file, flush)
    gzFile file;
    int flush;
{
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* check flush parameter */
    if (flush < 0 || flush > Z_FINISH)
        return Z_STREAM_ERROR;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* compress remaining data with requested flush */
    (void)gz_comp(state, flush);
    return state->err;
}